

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

void __thiscall TestMustache::testFloatValues(TestMustache *this)

{
  float fVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  QVariant *this_00;
  initializer_list<float> args;
  QVariantHash map;
  QString _template;
  QList<float> values;
  QString output;
  QString expectedOutput;
  QtVariantContext context;
  Renderer renderer;
  
  renderer.m_partialStack.super_QList<QString>.d.size._0_4_ = 0x3f800000;
  renderer._20_8_ = 0x404000003fc00000;
  renderer.m_partialStack.super_QList<QString>.d.d = (Data *)0xbf000000c0400000;
  renderer.m_partialStack.super_QList<QString>.d.ptr._0_4_ = 0;
  renderer.m_partialStack.super_QList<QString>.d.ptr._4_4_ = 0x3f000000;
  args._M_len = 7;
  args._M_array = (iterator)&renderer;
  QList<float>::QList(&values,args);
  iVar3 = QList<float>::begin(&values);
  iVar4 = QList<float>::end(&values);
  do {
    if (iVar3.i == iVar4.i) break;
    fVar1 = *iVar3.i;
    map.d = (Data *)0x0;
    ::QVariant::QVariant((QVariant *)&renderer,fVar1);
    QString::QString((QString *)&context,"val");
    this_00 = QHash<QString,_QVariant>::operator[](&map,(QString *)&context);
    ::QVariant::operator=(this_00,(QVariant *)&renderer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&context);
    ::QVariant::~QVariant((QVariant *)&renderer);
    QString::QString(&_template,"Value: {{val}}");
    QString::number((double)fVar1,(char)&renderer,0x67);
    operator+((QString *)&expectedOutput.d,"Value: ",(QString *)&renderer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&renderer);
    Mustache::Renderer::Renderer(&renderer);
    ::QVariant::QVariant((QVariant *)&output.d,(QHash *)&map);
    Mustache::QtVariantContext::QtVariantContext
              (&context,(QVariant *)&output.d,(PartialResolver *)0x0);
    ::QVariant::~QVariant((QVariant *)&output.d);
    Mustache::Renderer::render((QString *)&output.d,&renderer,&_template,&context.super_Context);
    bVar2 = QTest::qCompare((QString *)&output.d,(QString *)&expectedOutput.d,"output",
                            "expectedOutput",
                            "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                            ,0x48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&output.d);
    Mustache::QtVariantContext::~QtVariantContext(&context);
    Mustache::Renderer::~Renderer(&renderer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&expectedOutput.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&_template.d);
    QHash<QString,_QVariant>::~QHash(&map);
    iVar3.i = iVar3.i + 1;
  } while (bVar2);
  QArrayDataPointer<float>::~QArrayDataPointer(&values.d);
  return;
}

Assistant:

void TestMustache::testFloatValues()
{
  QList<float> values = {-3., -0.5, 0., 0.5, 1., 1.5, 3.};

  for (auto value : values) {
    QVariantHash map;
    map["val"] = value;
    QString _template = "Value: {{val}}";
    QString expectedOutput = "Value: " + QString::number(value);

    Mustache::Renderer renderer;
    Mustache::QtVariantContext context(map);
    QString output = renderer.render(_template, &context);

    QCOMPARE(output, expectedOutput);
  }
}